

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetMethodFromObject
              (Var instance,RecyclableObject *propertyObject,PropertyId propertyId,
              PropertyValueInfo *info,ScriptContext *scriptContext,bool isRootLd)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ThreadContext *this;
  PropertyRecord *this_00;
  JavascriptLibrary *this_01;
  FunctionBody *this_02;
  Utf8SourceInfo *this_03;
  bool isPropertyReference;
  FunctionBody *callerBody;
  JavascriptFunction *caller;
  char16 *propertyName;
  RootObjectBase *rootObject;
  RecyclableObject *pRStack_40;
  BOOL foundValue;
  Var value;
  ScriptContext *pSStack_30;
  bool isRootLd_local;
  ScriptContext *scriptContext_local;
  PropertyValueInfo *info_local;
  RecyclableObject *pRStack_18;
  PropertyId propertyId_local;
  RecyclableObject *propertyObject_local;
  Var instance_local;
  
  value._7_1_ = isRootLd;
  pSStack_30 = scriptContext;
  scriptContext_local = (ScriptContext *)info;
  info_local._4_4_ = propertyId;
  pRStack_18 = propertyObject;
  propertyObject_local = (RecyclableObject *)instance;
  BVar3 = IsPropertyObject(propertyObject);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x211c,"(IsPropertyObject(propertyObject))",
                                "IsPropertyObject(propertyObject)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRStack_40 = (RecyclableObject *)0x0;
  rootObject._4_4_ = 0;
  if ((value._7_1_ & 1) == 0) {
    rootObject._4_4_ =
         GetPropertyReference
                   (propertyObject_local,pRStack_18,info_local._4_4_,&stack0xffffffffffffffc0,
                    pSStack_30,(PropertyValueInfo *)scriptContext_local);
  }
  else {
    propertyName = (char16 *)VarTo<Js::RootObjectBase>(propertyObject_local);
    rootObject._4_4_ =
         GetRootPropertyReference
                   ((RecyclableObject *)propertyName,info_local._4_4_,&stack0xffffffffffffffc0,
                    pSStack_30,(PropertyValueInfo *)scriptContext_local);
  }
  if (rootObject._4_4_ == 0) {
    this = ScriptContext::GetThreadContext(pSStack_30);
    bVar2 = ThreadContext::RecordImplicitException(this);
    if (bVar2) {
      this_00 = ScriptContext::GetPropertyName(pSStack_30,info_local._4_4_);
      caller = (JavascriptFunction *)PropertyRecord::GetBuffer(this_00);
      this_01 = ScriptContext::GetLibrary(pSStack_30);
      pRStack_40 = JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
      callerBody = (FunctionBody *)0x0;
      BVar3 = JavascriptStackWalker::GetCaller((JavascriptFunction **)&callerBody,pSStack_30);
      if ((BVar3 != 0) &&
         (this_02 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)callerBody),
         this_02 != (FunctionBody *)0x0)) {
        this_03 = FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)this_02);
        bVar2 = Utf8SourceInfo::GetIsXDomain(this_03);
        if (bVar2) {
          caller = (JavascriptFunction *)0x0;
        }
      }
      if (((value._7_1_ ^ 0xff) & 1) == 0) {
        JavascriptError::ThrowReferenceError(pSStack_30,-0x7ff5ec6f,(PCWSTR)caller);
      }
      pRStack_40 = ThrowErrorObject::CreateThrowTypeErrorObject
                             (pSStack_30,-0x7ff5fe4a,(PCWSTR)caller);
    }
  }
  return pRStack_40;
}

Assistant:

Var JavascriptOperators::PatchGetMethodFromObject(Var instance, RecyclableObject* propertyObject, PropertyId propertyId, PropertyValueInfo * info, ScriptContext* scriptContext, bool isRootLd)
    {
        Assert(IsPropertyObject(propertyObject));

        Var value = nullptr;
        BOOL foundValue = FALSE;

        if (isRootLd)
        {
            RootObjectBase* rootObject = VarTo<RootObjectBase>(instance);
            foundValue = JavascriptOperators::GetRootPropertyReference(rootObject, propertyId, &value, scriptContext, info);
        }
        else
        {
            foundValue = JavascriptOperators::GetPropertyReference(instance, propertyObject, propertyId, &value, scriptContext, info);
        }

        if (!foundValue)
        {
            // Don't error if we disabled implicit calls
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                const char16* propertyName = scriptContext->GetPropertyName(propertyId)->GetBuffer();

                value = scriptContext->GetLibrary()->GetUndefined();
                JavascriptFunction * caller = NULL;
                if (JavascriptStackWalker::GetCaller(&caller, scriptContext))
                {
                    FunctionBody * callerBody = caller->GetFunctionBody();
                    if (callerBody && callerBody->GetUtf8SourceInfo()->GetIsXDomain())
                    {
                        propertyName = NULL;
                    }
                }

                // Prior to version 12 we had mistakenly immediately thrown an error for property reference method calls
                // (i.e. <expr>.foo() form) when the target object is the global object.  The spec says that a GetValue
                // on a reference should throw if the reference is unresolved, of which a property reference can never be,
                // however it can be unresolved in the case of an identifier expression, e.g. foo() with no qualification.
                // Such a case would come down to the global object if foo was undefined, hence the check for root object,
                // except that it should have been a check for isRootLd to be correct.
                //
                //   // (at global scope)
                //   foo(x());
                //
                // should throw an error before evaluating x() if foo is not defined, but
                //
                //   // (at global scope)
                //   this.foo(x());
                //
                // should evaluate x() before throwing an error if foo is not a property on the global object.
                // Maintain old behavior prior to version 12.
                bool isPropertyReference = !isRootLd;
                if (!isPropertyReference)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UndefVariable, propertyName);
                }
                else
                {
                    // ES5 11.2.3 #2: We evaluate the call target but don't throw yet if target member is missing. We need to evaluate argList
                    // first (#3). Postpone throwing error to invoke time.
                    value = ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext, VBSERR_OLENoPropOrMethod, propertyName);
                }
            }
        }
        return value;
    }